

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<8,_257,_true,_embree::avx::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  byte bVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [12];
  undefined1 auVar21 [28];
  undefined1 (*pauVar22) [16];
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar35 [16];
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  float fVar45;
  undefined1 auVar41 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar48 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar55 [32];
  float fVar60;
  vfloat4 a0;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar73;
  undefined1 auVar71 [16];
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar72 [64];
  float fVar78;
  float fVar82;
  float fVar83;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar81 [64];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  float fVar93;
  undefined1 auVar94 [32];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar95 [64];
  float fVar102;
  float fVar109;
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  float fVar107;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar106 [64];
  float fVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar116 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar127 [64];
  undefined1 auVar128 [32];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [8];
  float fStack_2598;
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  undefined1 local_2580 [8];
  float fStack_2578;
  float fStack_2574;
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined1 local_2550 [16];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0 [4];
  undefined1 local_23d0 [16];
  undefined1 local_23c0 [16];
  undefined1 local_23b0 [16];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  undefined1 auVar70 [32];
  undefined1 auVar105 [32];
  undefined1 auVar126 [32];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar35 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
    auVar34 = vrsqrtss_avx(auVar35,auVar35);
    fVar60 = auVar34._0_4_;
    local_2400 = (ray->super_RayK<1>).dir.field_0.m128[0];
    fStack_23fc = local_2400;
    fStack_23f8 = local_2400;
    fStack_23f4 = local_2400;
    fStack_23f0 = local_2400;
    fStack_23ec = local_2400;
    fStack_23e8 = local_2400;
    fStack_23e4 = local_2400;
    local_2420 = (ray->super_RayK<1>).dir.field_0.m128[1];
    fStack_241c = local_2420;
    fStack_2418 = local_2420;
    fStack_2414 = local_2420;
    fStack_2410 = local_2420;
    fStack_240c = local_2420;
    fStack_2408 = local_2420;
    fStack_2404 = local_2420;
    local_23e0[0] = fVar60 * 1.5 - auVar35._0_4_ * 0.5 * fVar60 * fVar60 * fVar60;
    local_2440 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fStack_243c = local_2440;
    fStack_2438 = local_2440;
    fStack_2434 = local_2440;
    fStack_2430 = local_2440;
    fStack_242c = local_2440;
    fStack_2428 = local_2440;
    fStack_2424 = local_2440;
    auVar36 = vshufps_avx(ZEXT416((uint)local_23e0[0]),ZEXT416((uint)local_23e0[0]),0);
    auVar61._0_4_ = aVar2.x * auVar36._0_4_;
    auVar61._4_4_ = aVar2.y * auVar36._4_4_;
    auVar61._8_4_ = aVar2.z * auVar36._8_4_;
    auVar61._12_4_ = aVar2.field_3.w * auVar36._12_4_;
    auVar34 = vshufpd_avx(auVar61,auVar61,1);
    auVar35 = vmovshdup_avx(auVar61);
    auVar88._8_4_ = 0x80000000;
    auVar88._0_8_ = 0x8000000080000000;
    auVar88._12_4_ = 0x80000000;
    auVar64._12_4_ = 0;
    auVar64._0_12_ = ZEXT812(0);
    auVar64 = auVar64 << 0x20;
    auVar79 = vunpckhps_avx(auVar61,auVar64);
    auVar62 = vshufps_avx(auVar79,ZEXT416(auVar35._0_4_ ^ 0x80000000),0x41);
    auVar79._0_8_ = auVar34._0_8_ ^ 0x8000000080000000;
    auVar79._8_8_ = auVar88._8_8_ ^ auVar34._8_8_;
    auVar79 = vinsertps_avx(auVar79,auVar61,0x2a);
    auVar35 = vdpps_avx(auVar62,auVar62,0x7f);
    auVar34 = vdpps_avx(auVar79,auVar79,0x7f);
    auVar35 = vcmpps_avx(auVar34,auVar35,1);
    auVar35 = vshufps_avx(auVar35,auVar35,0);
    auVar35 = vblendvps_avx(auVar79,auVar62,auVar35);
    auVar34 = vdpps_avx(auVar35,auVar35,0x7f);
    auVar79 = vrsqrtss_avx(auVar34,auVar34);
    fVar60 = auVar79._0_4_;
    auVar34 = ZEXT416((uint)(fVar60 * 1.5 - auVar34._0_4_ * 0.5 * fVar60 * fVar60 * fVar60));
    auVar34 = vshufps_avx(auVar34,auVar34,0);
    auVar71._0_4_ = auVar35._0_4_ * auVar34._0_4_;
    auVar71._4_4_ = auVar35._4_4_ * auVar34._4_4_;
    auVar71._8_4_ = auVar35._8_4_ * auVar34._8_4_;
    auVar71._12_4_ = auVar35._12_4_ * auVar34._12_4_;
    auVar35 = vshufps_avx(auVar71,auVar71,0xc9);
    auVar34 = vshufps_avx(auVar61,auVar61,0xc9);
    auVar89._0_4_ = auVar34._0_4_ * auVar71._0_4_;
    auVar89._4_4_ = auVar34._4_4_ * auVar71._4_4_;
    auVar89._8_4_ = auVar34._8_4_ * auVar71._8_4_;
    auVar89._12_4_ = auVar34._12_4_ * auVar71._12_4_;
    auVar80._0_4_ = auVar61._0_4_ * auVar35._0_4_;
    auVar80._4_4_ = auVar61._4_4_ * auVar35._4_4_;
    auVar80._8_4_ = auVar61._8_4_ * auVar35._8_4_;
    auVar80._12_4_ = auVar61._12_4_ * auVar35._12_4_;
    auVar35 = vsubps_avx(auVar80,auVar89);
    auVar79 = vshufps_avx(auVar35,auVar35,0xc9);
    auVar35 = vdpps_avx(auVar79,auVar79,0x7f);
    auVar34 = vrsqrtss_avx(auVar35,auVar35);
    fVar60 = auVar34._0_4_;
    auVar35 = ZEXT416((uint)(fVar60 * 1.5 - fVar60 * fVar60 * fVar60 * auVar35._0_4_ * 0.5));
    auVar35 = vshufps_avx(auVar35,auVar35,0);
    auVar34._0_4_ = auVar35._0_4_ * auVar79._0_4_;
    auVar34._4_4_ = auVar35._4_4_ * auVar79._4_4_;
    auVar34._8_4_ = auVar35._8_4_ * auVar79._8_4_;
    auVar34._12_4_ = auVar35._12_4_ * auVar79._12_4_;
    auVar35._0_4_ = auVar36._0_4_ * auVar61._0_4_;
    auVar35._4_4_ = auVar36._4_4_ * auVar61._4_4_;
    auVar35._8_4_ = auVar36._8_4_ * auVar61._8_4_;
    auVar35._12_4_ = auVar36._12_4_ * auVar61._12_4_;
    auVar79 = vunpcklps_avx(auVar71,auVar35);
    auVar35 = vunpckhps_avx(auVar71,auVar35);
    auVar36 = vunpcklps_avx(auVar34,auVar64);
    auVar34 = vunpckhps_avx(auVar34,auVar64);
    local_23b0 = vunpcklps_avx(auVar35,auVar34);
    local_23d0 = vunpcklps_avx(auVar79,auVar36);
    local_23c0 = vunpckhps_avx(auVar79,auVar36);
    pauVar30 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar36 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar62._8_4_ = 0x7fffffff;
    auVar62._0_8_ = 0x7fffffff7fffffff;
    auVar62._12_4_ = 0x7fffffff;
    auVar35 = vandps_avx((undefined1  [16])aVar2,auVar62);
    auVar65._8_4_ = 0x219392ef;
    auVar65._0_8_ = 0x219392ef219392ef;
    auVar65._12_4_ = 0x219392ef;
    auVar35 = vcmpps_avx(auVar35,auVar65,1);
    auVar66._8_4_ = 0x3f800000;
    auVar66._0_8_ = 0x3f8000003f800000;
    auVar66._12_4_ = 0x3f800000;
    auVar34 = vdivps_avx(auVar66,(undefined1  [16])aVar2);
    auVar67._8_4_ = 0x5d5e0b6b;
    auVar67._0_8_ = 0x5d5e0b6b5d5e0b6b;
    auVar67._12_4_ = 0x5d5e0b6b;
    auVar35 = vblendvps_avx(auVar34,auVar67,auVar35);
    auVar63._0_4_ = auVar35._0_4_ * 0.99999964;
    auVar63._4_4_ = auVar35._4_4_ * 0.99999964;
    auVar63._8_4_ = auVar35._8_4_ * 0.99999964;
    auVar63._12_4_ = auVar35._12_4_ * 0.99999964;
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_2460._4_4_ = uVar1;
    local_2460._0_4_ = uVar1;
    local_2460._8_4_ = uVar1;
    local_2460._12_4_ = uVar1;
    local_2460._16_4_ = uVar1;
    local_2460._20_4_ = uVar1;
    local_2460._24_4_ = uVar1;
    local_2460._28_4_ = uVar1;
    auVar81 = ZEXT3264(local_2460);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2480._4_4_ = uVar1;
    local_2480._0_4_ = uVar1;
    local_2480._8_4_ = uVar1;
    local_2480._12_4_ = uVar1;
    local_2480._16_4_ = uVar1;
    local_2480._20_4_ = uVar1;
    local_2480._24_4_ = uVar1;
    local_2480._28_4_ = uVar1;
    auVar90 = ZEXT3264(local_2480);
    fVar60 = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar128._4_4_ = fVar60;
    auVar128._0_4_ = fVar60;
    auVar128._8_4_ = fVar60;
    auVar128._12_4_ = fVar60;
    auVar128._16_4_ = fVar60;
    auVar128._20_4_ = fVar60;
    auVar128._24_4_ = fVar60;
    auVar128._28_4_ = fVar60;
    auVar32._0_4_ = auVar35._0_4_ * 1.0000004;
    auVar32._4_4_ = auVar35._4_4_ * 1.0000004;
    auVar32._8_4_ = auVar35._8_4_ * 1.0000004;
    auVar32._12_4_ = auVar35._12_4_ * 1.0000004;
    auVar35 = vshufps_avx(auVar63,auVar63,0);
    local_24a0._16_16_ = auVar35;
    local_24a0._0_16_ = auVar35;
    auVar92 = ZEXT3264(local_24a0);
    auVar35 = vmovshdup_avx(auVar63);
    auVar34 = vshufps_avx(auVar63,auVar63,0x55);
    local_24c0._16_16_ = auVar34;
    local_24c0._0_16_ = auVar34;
    auVar95 = ZEXT3264(local_24c0);
    auVar34 = vshufpd_avx(auVar63,auVar63,1);
    auVar62 = vshufps_avx(auVar63,auVar63,0xaa);
    local_24e0._16_16_ = auVar62;
    local_24e0._0_16_ = auVar62;
    auVar106 = ZEXT3264(local_24e0);
    auVar62 = vshufps_avx(auVar32,auVar32,0);
    local_2500._16_16_ = auVar62;
    local_2500._0_16_ = auVar62;
    auVar116 = ZEXT3264(local_2500);
    uVar29 = (ulong)(auVar63._0_4_ < 0.0) * 0x20;
    auVar62 = vshufps_avx(auVar32,auVar32,0x55);
    local_2520._16_16_ = auVar62;
    local_2520._0_16_ = auVar62;
    auVar123 = ZEXT3264(local_2520);
    auVar62 = vshufps_avx(auVar32,auVar32,0xaa);
    uVar28 = (ulong)(auVar35._0_4_ < 0.0) << 5 | 0x40;
    local_2540._16_16_ = auVar62;
    local_2540._0_16_ = auVar62;
    auVar127 = ZEXT3264(local_2540);
    uVar31 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
    auVar35 = vshufps_avx(auVar79,auVar79,0);
    local_25c0._16_16_ = auVar35;
    local_25c0._0_16_ = auVar35;
    auVar72 = ZEXT3264(local_25c0);
    auVar35 = vshufps_avx(auVar36,auVar36,0);
    auVar33 = ZEXT3264(CONCAT1616(auVar35,auVar35));
LAB_00e4ff4a:
    if (pauVar30 != (undefined1 (*) [16])&local_23a0) {
      pauVar22 = pauVar30 + -1;
      pauVar30 = pauVar30 + -1;
      if (*(float *)(*pauVar22 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar25 = *(ulong *)*pauVar30;
LAB_00e4ff71:
        if ((uVar25 & 0xf) == 0) {
          auVar91 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar29),auVar81._0_32_);
          auVar10._4_4_ = auVar92._4_4_ * auVar91._4_4_;
          auVar10._0_4_ = auVar92._0_4_ * auVar91._0_4_;
          auVar10._8_4_ = auVar92._8_4_ * auVar91._8_4_;
          auVar10._12_4_ = auVar92._12_4_ * auVar91._12_4_;
          auVar10._16_4_ = auVar92._16_4_ * auVar91._16_4_;
          auVar10._20_4_ = auVar92._20_4_ * auVar91._20_4_;
          auVar10._24_4_ = auVar92._24_4_ * auVar91._24_4_;
          auVar10._28_4_ = auVar91._28_4_;
          auVar91 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar28),auVar90._0_32_);
          auVar11._4_4_ = auVar95._4_4_ * auVar91._4_4_;
          auVar11._0_4_ = auVar95._0_4_ * auVar91._0_4_;
          auVar11._8_4_ = auVar95._8_4_ * auVar91._8_4_;
          auVar11._12_4_ = auVar95._12_4_ * auVar91._12_4_;
          auVar11._16_4_ = auVar95._16_4_ * auVar91._16_4_;
          auVar11._20_4_ = auVar95._20_4_ * auVar91._20_4_;
          auVar11._24_4_ = auVar95._24_4_ * auVar91._24_4_;
          auVar11._28_4_ = auVar91._28_4_;
          auVar91 = vmaxps_avx(auVar10,auVar11);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar31),auVar128);
          auVar12._4_4_ = auVar106._4_4_ * auVar6._4_4_;
          auVar12._0_4_ = auVar106._0_4_ * auVar6._0_4_;
          auVar12._8_4_ = auVar106._8_4_ * auVar6._8_4_;
          auVar12._12_4_ = auVar106._12_4_ * auVar6._12_4_;
          auVar12._16_4_ = auVar106._16_4_ * auVar6._16_4_;
          auVar12._20_4_ = auVar106._20_4_ * auVar6._20_4_;
          auVar12._24_4_ = auVar106._24_4_ * auVar6._24_4_;
          auVar12._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar29 ^ 0x20)),auVar81._0_32_
                             );
          auVar13._4_4_ = auVar116._4_4_ * auVar6._4_4_;
          auVar13._0_4_ = auVar116._0_4_ * auVar6._0_4_;
          auVar13._8_4_ = auVar116._8_4_ * auVar6._8_4_;
          auVar13._12_4_ = auVar116._12_4_ * auVar6._12_4_;
          auVar13._16_4_ = auVar116._16_4_ * auVar6._16_4_;
          auVar13._20_4_ = auVar116._20_4_ * auVar6._20_4_;
          auVar13._24_4_ = auVar116._24_4_ * auVar6._24_4_;
          auVar13._28_4_ = auVar6._28_4_;
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar28 ^ 0x20)),auVar90._0_32_
                             );
          auVar14._4_4_ = auVar123._4_4_ * auVar6._4_4_;
          auVar14._0_4_ = auVar123._0_4_ * auVar6._0_4_;
          auVar14._8_4_ = auVar123._8_4_ * auVar6._8_4_;
          auVar14._12_4_ = auVar123._12_4_ * auVar6._12_4_;
          auVar14._16_4_ = auVar123._16_4_ * auVar6._16_4_;
          auVar14._20_4_ = auVar123._20_4_ * auVar6._20_4_;
          auVar14._24_4_ = auVar123._24_4_ * auVar6._24_4_;
          auVar14._28_4_ = auVar6._28_4_;
          auVar41 = vminps_avx(auVar13,auVar14);
          auVar6 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar31 ^ 0x20)),auVar128);
          auVar15._4_4_ = auVar127._4_4_ * auVar6._4_4_;
          auVar15._0_4_ = auVar127._0_4_ * auVar6._0_4_;
          auVar15._8_4_ = auVar127._8_4_ * auVar6._8_4_;
          auVar15._12_4_ = auVar127._12_4_ * auVar6._12_4_;
          auVar15._16_4_ = auVar127._16_4_ * auVar6._16_4_;
          auVar15._20_4_ = auVar127._20_4_ * auVar6._20_4_;
          auVar15._24_4_ = auVar127._24_4_ * auVar6._24_4_;
          auVar15._28_4_ = auVar6._28_4_;
          auVar6 = vmaxps_avx(auVar12,auVar72._0_32_);
          local_25e0 = vmaxps_avx(auVar91,auVar6);
          auVar91 = vminps_avx(auVar15,auVar33._0_32_);
          auVar91 = vminps_avx(auVar41,auVar91);
          auVar91 = vcmpps_avx(local_25e0,auVar91,2);
          auVar35 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
        }
        else {
          if ((int)(uVar25 & 0xf) != 2) {
            (**(code **)((long)This->leafIntersector +
                        (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40))
                      (local_23e0,ray,context);
            fVar42 = (ray->super_RayK<1>).tfar;
            auVar33 = ZEXT3264(CONCAT428(fVar42,CONCAT424(fVar42,CONCAT420(fVar42,CONCAT416(fVar42,
                                                  CONCAT412(fVar42,CONCAT48(fVar42,CONCAT44(fVar42,
                                                  fVar42))))))));
            auVar81 = ZEXT3264(local_2460);
            auVar90 = ZEXT3264(local_2480);
            auVar92 = ZEXT3264(local_24a0);
            auVar95 = ZEXT3264(local_24c0);
            auVar106 = ZEXT3264(local_24e0);
            auVar116 = ZEXT3264(local_2500);
            auVar123 = ZEXT3264(local_2520);
            auVar127 = ZEXT3264(local_2540);
            auVar72 = ZEXT3264(local_25c0);
            goto LAB_00e4ff4a;
          }
          uVar23 = uVar25 & 0xfffffffffffffff0;
          auVar20 = *(undefined1 (*) [12])(uVar23 + 0x60);
          fStack_2590 = *(float *)(uVar23 + 0x70);
          fStack_258c = *(float *)(uVar23 + 0x74);
          fStack_2588 = *(float *)(uVar23 + 0x78);
          uStack_2584 = *(undefined4 *)(uVar23 + 0x7c);
          auVar21 = *(undefined1 (*) [28])(uVar23 + 0x80);
          fVar42 = *(float *)(uVar23 + 0xbc);
          auVar104._0_4_ =
               local_2440 * *(float *)(uVar23 + 0x100) + local_2420 * *(float *)(uVar23 + 0xa0) +
               local_2400 * *(float *)(uVar23 + 0x40);
          auVar104._4_4_ =
               fStack_243c * *(float *)(uVar23 + 0x104) + fStack_241c * *(float *)(uVar23 + 0xa4) +
               fStack_23fc * *(float *)(uVar23 + 0x44);
          auVar104._8_4_ =
               fStack_2438 * *(float *)(uVar23 + 0x108) + fStack_2418 * *(float *)(uVar23 + 0xa8) +
               fStack_23f8 * *(float *)(uVar23 + 0x48);
          auVar104._12_4_ =
               fStack_2434 * *(float *)(uVar23 + 0x10c) + fStack_2414 * *(float *)(uVar23 + 0xac) +
               fStack_23f4 * *(float *)(uVar23 + 0x4c);
          auVar104._16_4_ =
               fStack_2430 * *(float *)(uVar23 + 0x110) + fStack_2410 * *(float *)(uVar23 + 0xb0) +
               fStack_23f0 * *(float *)(uVar23 + 0x50);
          auVar104._20_4_ =
               fStack_242c * *(float *)(uVar23 + 0x114) + fStack_240c * *(float *)(uVar23 + 0xb4) +
               fStack_23ec * *(float *)(uVar23 + 0x54);
          auVar104._24_4_ =
               fStack_2428 * *(float *)(uVar23 + 0x118) + fStack_2408 * *(float *)(uVar23 + 0xb8) +
               fStack_23e8 * *(float *)(uVar23 + 0x58);
          auVar104._28_4_ = auVar90._28_4_ + auVar106._28_4_ + fStack_2404;
          auVar114._0_4_ =
               local_2440 * *(float *)(uVar23 + 0x120) + local_2420 * *(float *)(uVar23 + 0xc0) +
               local_2400 * *(float *)*(undefined1 (*) [12])(uVar23 + 0x60);
          auVar114._4_4_ =
               fStack_243c * *(float *)(uVar23 + 0x124) + fStack_241c * *(float *)(uVar23 + 0xc4) +
               fStack_23fc * *(float *)(uVar23 + 100);
          auVar114._8_4_ =
               fStack_2438 * *(float *)(uVar23 + 0x128) + fStack_2418 * *(float *)(uVar23 + 200) +
               fStack_23f8 * *(float *)(uVar23 + 0x68);
          auVar114._12_4_ =
               fStack_2434 * *(float *)(uVar23 + 300) + fStack_2414 * *(float *)(uVar23 + 0xcc) +
               fStack_23f4 * *(float *)(uVar23 + 0x6c);
          auVar114._16_4_ =
               fStack_2430 * *(float *)(uVar23 + 0x130) + fStack_2410 * *(float *)(uVar23 + 0xd0) +
               fStack_23f0 * fStack_2590;
          auVar114._20_4_ =
               fStack_242c * *(float *)(uVar23 + 0x134) + fStack_240c * *(float *)(uVar23 + 0xd4) +
               fStack_23ec * fStack_258c;
          auVar114._24_4_ =
               fStack_2428 * *(float *)(uVar23 + 0x138) + fStack_2408 * *(float *)(uVar23 + 0xd8) +
               fStack_23e8 * fStack_2588;
          auVar114._28_4_ = auVar92._28_4_ + auVar116._28_4_ + fStack_2404;
          auVar94._0_4_ =
               local_2440 * *(float *)(uVar23 + 0x140) + local_2420 * *(float *)(uVar23 + 0xe0) +
               local_2400 * *(float *)*(undefined1 (*) [28])(uVar23 + 0x80);
          auVar94._4_4_ =
               fStack_243c * *(float *)(uVar23 + 0x144) + fStack_241c * *(float *)(uVar23 + 0xe4) +
               fStack_23fc * *(float *)(uVar23 + 0x84);
          auVar94._8_4_ =
               fStack_2438 * *(float *)(uVar23 + 0x148) + fStack_2418 * *(float *)(uVar23 + 0xe8) +
               fStack_23f8 * *(float *)(uVar23 + 0x88);
          auVar94._12_4_ =
               fStack_2434 * *(float *)(uVar23 + 0x14c) + fStack_2414 * *(float *)(uVar23 + 0xec) +
               fStack_23f4 * *(float *)(uVar23 + 0x8c);
          auVar94._16_4_ =
               fStack_2430 * *(float *)(uVar23 + 0x150) + fStack_2410 * *(float *)(uVar23 + 0xf0) +
               fStack_23f0 * *(float *)(uVar23 + 0x90);
          auVar94._20_4_ =
               fStack_242c * *(float *)(uVar23 + 0x154) + fStack_240c * *(float *)(uVar23 + 0xf4) +
               fStack_23ec * *(float *)(uVar23 + 0x94);
          auVar94._24_4_ =
               fStack_2428 * *(float *)(uVar23 + 0x158) + fStack_2408 * *(float *)(uVar23 + 0xf8) +
               fStack_23e8 * *(float *)(uVar23 + 0x98);
          auVar94._28_4_ = auVar95._28_4_ + fStack_2404 + fStack_2404;
          auVar39._8_4_ = 0x7fffffff;
          auVar39._0_8_ = 0x7fffffff7fffffff;
          auVar39._12_4_ = 0x7fffffff;
          auVar39._16_4_ = 0x7fffffff;
          auVar39._20_4_ = 0x7fffffff;
          auVar39._24_4_ = 0x7fffffff;
          auVar39._28_4_ = 0x7fffffff;
          auVar91 = vandps_avx(auVar104,auVar39);
          auVar125._8_4_ = 0x219392ef;
          auVar125._0_8_ = 0x219392ef219392ef;
          auVar125._12_4_ = 0x219392ef;
          auVar125._16_4_ = 0x219392ef;
          auVar125._20_4_ = 0x219392ef;
          auVar125._24_4_ = 0x219392ef;
          auVar125._28_4_ = 0x219392ef;
          auVar91 = vcmpps_avx(auVar91,auVar125,1);
          auVar6 = vblendvps_avx(auVar104,auVar125,auVar91);
          auVar91 = vandps_avx(auVar114,auVar39);
          auVar91 = vcmpps_avx(auVar91,auVar125,1);
          auVar41 = vblendvps_avx(auVar114,auVar125,auVar91);
          auVar91 = vandps_avx(auVar94,auVar39);
          auVar91 = vcmpps_avx(auVar91,auVar125,1);
          auVar91 = vblendvps_avx(auVar94,auVar125,auVar91);
          auVar39 = vrcpps_avx(auVar6);
          fVar93 = auVar39._0_4_;
          fVar96 = auVar39._4_4_;
          auVar7._4_4_ = fVar96 * auVar6._4_4_;
          auVar7._0_4_ = fVar93 * auVar6._0_4_;
          fVar97 = auVar39._8_4_;
          auVar7._8_4_ = fVar97 * auVar6._8_4_;
          fVar98 = auVar39._12_4_;
          auVar7._12_4_ = fVar98 * auVar6._12_4_;
          fVar99 = auVar39._16_4_;
          auVar7._16_4_ = fVar99 * auVar6._16_4_;
          fVar100 = auVar39._20_4_;
          auVar7._20_4_ = fVar100 * auVar6._20_4_;
          fVar101 = auVar39._24_4_;
          auVar7._24_4_ = fVar101 * auVar6._24_4_;
          auVar7._28_4_ = auVar6._28_4_;
          auVar40._8_4_ = 0x3f800000;
          auVar40._0_8_ = 0x3f8000003f800000;
          auVar40._12_4_ = 0x3f800000;
          auVar40._16_4_ = 0x3f800000;
          auVar40._20_4_ = 0x3f800000;
          auVar40._24_4_ = 0x3f800000;
          auVar40._28_4_ = 0x3f800000;
          auVar7 = vsubps_avx(auVar40,auVar7);
          fVar93 = fVar93 + fVar93 * auVar7._0_4_;
          fVar96 = fVar96 + fVar96 * auVar7._4_4_;
          fVar97 = fVar97 + fVar97 * auVar7._8_4_;
          fVar98 = fVar98 + fVar98 * auVar7._12_4_;
          fVar99 = fVar99 + fVar99 * auVar7._16_4_;
          fVar100 = fVar100 + fVar100 * auVar7._20_4_;
          fVar101 = fVar101 + fVar101 * auVar7._24_4_;
          auVar6 = vrcpps_avx(auVar41);
          fVar102 = auVar6._0_4_;
          fVar107 = auVar6._4_4_;
          auVar8._4_4_ = fVar107 * auVar41._4_4_;
          auVar8._0_4_ = fVar102 * auVar41._0_4_;
          fVar108 = auVar6._8_4_;
          auVar8._8_4_ = fVar108 * auVar41._8_4_;
          fVar109 = auVar6._12_4_;
          auVar8._12_4_ = fVar109 * auVar41._12_4_;
          fVar110 = auVar6._16_4_;
          auVar8._16_4_ = fVar110 * auVar41._16_4_;
          fVar111 = auVar6._20_4_;
          auVar8._20_4_ = fVar111 * auVar41._20_4_;
          fVar112 = auVar6._24_4_;
          auVar8._24_4_ = fVar112 * auVar41._24_4_;
          auVar8._28_4_ = auVar41._28_4_;
          auVar8 = vsubps_avx(auVar40,auVar8);
          fVar102 = fVar102 + fVar102 * auVar8._0_4_;
          fVar107 = fVar107 + fVar107 * auVar8._4_4_;
          fVar108 = fVar108 + fVar108 * auVar8._8_4_;
          fVar109 = fVar109 + fVar109 * auVar8._12_4_;
          fVar110 = fVar110 + fVar110 * auVar8._16_4_;
          fVar111 = fVar111 + fVar111 * auVar8._20_4_;
          fVar112 = fVar112 + fVar112 * auVar8._24_4_;
          auVar41 = vrcpps_avx(auVar91);
          fVar113 = auVar41._0_4_;
          fVar117 = auVar41._4_4_;
          auVar16._4_4_ = fVar117 * auVar91._4_4_;
          auVar16._0_4_ = fVar113 * auVar91._0_4_;
          fVar118 = auVar41._8_4_;
          auVar16._8_4_ = fVar118 * auVar91._8_4_;
          fVar119 = auVar41._12_4_;
          auVar16._12_4_ = fVar119 * auVar91._12_4_;
          fVar120 = auVar41._16_4_;
          auVar16._16_4_ = fVar120 * auVar91._16_4_;
          fVar121 = auVar41._20_4_;
          auVar16._20_4_ = fVar121 * auVar91._20_4_;
          fVar122 = auVar41._24_4_;
          auVar16._24_4_ = fVar122 * auVar91._24_4_;
          auVar16._28_4_ = auVar91._28_4_;
          auVar91 = vsubps_avx(auVar40,auVar16);
          fVar113 = fVar113 + fVar113 * auVar91._0_4_;
          fVar117 = fVar117 + fVar117 * auVar91._4_4_;
          fVar118 = fVar118 + fVar118 * auVar91._8_4_;
          fVar119 = fVar119 + fVar119 * auVar91._12_4_;
          fVar120 = fVar120 + fVar120 * auVar91._16_4_;
          fVar121 = fVar121 + fVar121 * auVar91._20_4_;
          fVar122 = fVar122 + fVar122 * auVar91._24_4_;
          fVar43 = local_2480._0_4_;
          fVar44 = local_2480._4_4_;
          fVar73 = local_2480._8_4_;
          fVar74 = local_2480._12_4_;
          fVar75 = local_2480._16_4_;
          fVar76 = local_2480._20_4_;
          fVar77 = local_2480._24_4_;
          fVar52 = fVar42 + *(float *)(uVar23 + 0x11c) + *(float *)(uVar23 + 0x17c);
          fVar45 = fVar42 + *(float *)(uVar23 + 0x13c) + *(float *)(uVar23 + 0x19c);
          auVar81 = ZEXT3264(local_2460);
          fVar78 = local_2460._0_4_;
          fVar82 = local_2460._4_4_;
          fVar83 = local_2460._8_4_;
          fVar84 = local_2460._12_4_;
          fVar85 = local_2460._16_4_;
          fVar86 = local_2460._20_4_;
          fVar87 = local_2460._24_4_;
          fVar59 = *(float *)(uVar23 + 0x5c) + fVar52;
          auVar53._0_4_ =
               -fVar93 * (fVar78 * *(float *)(uVar23 + 0x40) +
                         fVar43 * *(float *)(uVar23 + 0xa0) +
                         fVar60 * *(float *)(uVar23 + 0x100) + *(float *)(uVar23 + 0x160));
          auVar53._4_4_ =
               -fVar96 * (fVar82 * *(float *)(uVar23 + 0x44) +
                         fVar44 * *(float *)(uVar23 + 0xa4) +
                         fVar60 * *(float *)(uVar23 + 0x104) + *(float *)(uVar23 + 0x164));
          auVar53._8_4_ =
               -fVar97 * (fVar83 * *(float *)(uVar23 + 0x48) +
                         fVar73 * *(float *)(uVar23 + 0xa8) +
                         fVar60 * *(float *)(uVar23 + 0x108) + *(float *)(uVar23 + 0x168));
          auVar53._12_4_ =
               -fVar98 * (fVar84 * *(float *)(uVar23 + 0x4c) +
                         fVar74 * *(float *)(uVar23 + 0xac) +
                         fVar60 * *(float *)(uVar23 + 0x10c) + *(float *)(uVar23 + 0x16c));
          fVar56 = -fVar99 * (fVar85 * *(float *)(uVar23 + 0x50) +
                             fVar75 * *(float *)(uVar23 + 0xb0) +
                             fVar60 * *(float *)(uVar23 + 0x110) + *(float *)(uVar23 + 0x170));
          auVar17._16_4_ = fVar56;
          auVar17._0_16_ = auVar53;
          fVar57 = -fVar100 *
                   (fVar86 * *(float *)(uVar23 + 0x54) +
                   fVar76 * *(float *)(uVar23 + 0xb4) +
                   fVar60 * *(float *)(uVar23 + 0x114) + *(float *)(uVar23 + 0x174));
          auVar17._20_4_ = fVar57;
          fVar58 = -fVar101 *
                   (fVar87 * *(float *)(uVar23 + 0x58) +
                   fVar77 * *(float *)(uVar23 + 0xb8) +
                   fVar60 * *(float *)(uVar23 + 0x118) + *(float *)(uVar23 + 0x178));
          auVar17._24_4_ = fVar58;
          auVar17._28_4_ = fVar59;
          local_25a0._0_4_ = auVar20._0_4_;
          local_25a0._4_4_ = auVar20._4_4_;
          fStack_2598 = auVar20._8_4_;
          fVar52 = fVar52 + fVar45;
          auVar46._0_4_ =
               -fVar102 *
               (fVar78 * (float)local_25a0._0_4_ +
               *(float *)(uVar23 + 0xc0) * fVar43 +
               *(float *)(uVar23 + 0x120) * fVar60 + *(float *)(uVar23 + 0x180));
          auVar46._4_4_ =
               -fVar107 *
               (fVar82 * (float)local_25a0._4_4_ +
               *(float *)(uVar23 + 0xc4) * fVar44 +
               *(float *)(uVar23 + 0x124) * fVar60 + *(float *)(uVar23 + 0x184));
          auVar46._8_4_ =
               -fVar108 *
               (fVar83 * fStack_2598 +
               *(float *)(uVar23 + 200) * fVar73 +
               *(float *)(uVar23 + 0x128) * fVar60 + *(float *)(uVar23 + 0x188));
          auVar46._12_4_ =
               -fVar109 *
               (fVar84 * *(float *)(uVar23 + 0x6c) +
               *(float *)(uVar23 + 0xcc) * fVar74 +
               *(float *)(uVar23 + 300) * fVar60 + *(float *)(uVar23 + 0x18c));
          fVar49 = -fVar110 *
                   (fVar85 * fStack_2590 +
                   *(float *)(uVar23 + 0xd0) * fVar75 +
                   *(float *)(uVar23 + 0x130) * fVar60 + *(float *)(uVar23 + 400));
          auVar18._16_4_ = fVar49;
          auVar18._0_16_ = auVar46;
          fVar50 = -fVar111 *
                   (fVar86 * fStack_258c +
                   *(float *)(uVar23 + 0xd4) * fVar76 +
                   *(float *)(uVar23 + 0x134) * fVar60 + *(float *)(uVar23 + 0x194));
          auVar18._20_4_ = fVar50;
          fVar51 = -fVar112 *
                   (fVar87 * fStack_2588 +
                   *(float *)(uVar23 + 0xd8) * fVar77 +
                   *(float *)(uVar23 + 0x138) * fVar60 + *(float *)(uVar23 + 0x198));
          auVar18._24_4_ = fVar51;
          auVar18._28_4_ = fVar52;
          local_2580._0_4_ = auVar21._0_4_;
          local_2580._4_4_ = auVar21._4_4_;
          fStack_2578 = auVar21._8_4_;
          fStack_2574 = auVar21._12_4_;
          fStack_2570 = auVar21._16_4_;
          fStack_256c = auVar21._20_4_;
          fStack_2568 = auVar21._24_4_;
          fVar45 = fVar45 + fVar42 + *(float *)(uVar23 + 0x15c) + *(float *)(uVar23 + 0x1bc);
          auVar36._0_4_ =
               -fVar113 *
               (fVar78 * (float)local_2580._0_4_ +
               *(float *)(uVar23 + 0xe0) * fVar43 +
               *(float *)(uVar23 + 0x140) * fVar60 + *(float *)(uVar23 + 0x1a0));
          auVar36._4_4_ =
               -fVar117 *
               (fVar82 * (float)local_2580._4_4_ +
               *(float *)(uVar23 + 0xe4) * fVar44 +
               *(float *)(uVar23 + 0x144) * fVar60 + *(float *)(uVar23 + 0x1a4));
          auVar36._8_4_ =
               -fVar118 *
               (fVar83 * fStack_2578 +
               *(float *)(uVar23 + 0xe8) * fVar73 +
               *(float *)(uVar23 + 0x148) * fVar60 + *(float *)(uVar23 + 0x1a8));
          auVar36._12_4_ =
               -fVar119 *
               (fVar84 * fStack_2574 +
               *(float *)(uVar23 + 0xec) * fVar74 +
               *(float *)(uVar23 + 0x14c) * fVar60 + *(float *)(uVar23 + 0x1ac));
          fVar42 = -fVar120 *
                   (fVar85 * fStack_2570 +
                   *(float *)(uVar23 + 0xf0) * fVar75 +
                   *(float *)(uVar23 + 0x150) * fVar60 + *(float *)(uVar23 + 0x1b0));
          auVar19._16_4_ = fVar42;
          auVar19._0_16_ = auVar36;
          fVar43 = -fVar121 *
                   (fVar86 * fStack_256c +
                   *(float *)(uVar23 + 0xf4) * fVar76 +
                   *(float *)(uVar23 + 0x154) * fVar60 + *(float *)(uVar23 + 0x1b4));
          auVar19._20_4_ = fVar43;
          fVar44 = -fVar122 *
                   (fVar87 * fStack_2568 +
                   *(float *)(uVar23 + 0xf8) * fVar77 +
                   *(float *)(uVar23 + 0x158) * fVar60 + *(float *)(uVar23 + 0x1b8));
          auVar19._24_4_ = fVar44;
          auVar19._28_4_ = fVar45;
          auVar68._0_4_ = fVar93 + auVar53._0_4_;
          auVar68._4_4_ = fVar96 + auVar53._4_4_;
          auVar68._8_4_ = fVar97 + auVar53._8_4_;
          auVar68._12_4_ = fVar98 + auVar53._12_4_;
          auVar70._16_4_ = fVar99 + fVar56;
          auVar70._0_16_ = auVar68;
          auVar70._20_4_ = fVar100 + fVar57;
          auVar70._24_4_ = fVar101 + fVar58;
          auVar70._28_4_ = auVar39._28_4_ + auVar7._28_4_ + fVar59;
          auVar103._0_4_ = fVar102 + auVar46._0_4_;
          auVar103._4_4_ = fVar107 + auVar46._4_4_;
          auVar103._8_4_ = fVar108 + auVar46._8_4_;
          auVar103._12_4_ = fVar109 + auVar46._12_4_;
          auVar105._16_4_ = fVar110 + fVar49;
          auVar105._0_16_ = auVar103;
          auVar105._20_4_ = fVar111 + fVar50;
          auVar105._24_4_ = fVar112 + fVar51;
          auVar105._28_4_ = auVar6._28_4_ + auVar8._28_4_ + fVar52;
          auVar124._0_4_ = fVar113 + auVar36._0_4_;
          auVar124._4_4_ = fVar117 + auVar36._4_4_;
          auVar124._8_4_ = fVar118 + auVar36._8_4_;
          auVar124._12_4_ = fVar119 + auVar36._12_4_;
          auVar126._16_4_ = fVar120 + fVar42;
          auVar126._0_16_ = auVar124;
          auVar126._20_4_ = fVar121 + fVar43;
          auVar126._24_4_ = fVar122 + fVar44;
          auVar126._28_4_ = auVar41._28_4_ + auVar91._28_4_ + fVar45;
          _local_25a0 = auVar70._16_16_;
          auVar35 = vpminsd_avx(auVar17._16_16_,_local_25a0);
          auVar34 = vpminsd_avx(auVar53,auVar68);
          register0x00001310 = auVar35;
          _local_2580 = auVar34;
          local_2550 = auVar105._16_16_;
          auVar35 = vpminsd_avx(auVar18._16_16_,local_2550);
          auVar34 = vpminsd_avx(auVar46,auVar103);
          auVar115._16_16_ = auVar35;
          auVar115._0_16_ = auVar34;
          auVar35 = vpminsd_avx(auVar19._16_16_,auVar126._16_16_);
          auVar34 = vpminsd_avx(auVar36,auVar124);
          auVar91._16_16_ = auVar35;
          auVar91._0_16_ = auVar34;
          auVar91 = vmaxps_avx(auVar115,auVar91);
          auVar35 = vpmaxsd_avx(auVar17._16_16_,_local_25a0);
          auVar34 = vpmaxsd_avx(auVar53,auVar68);
          auVar55._16_16_ = auVar35;
          auVar55._0_16_ = auVar34;
          auVar90 = ZEXT3264(local_2480);
          auVar35 = vpmaxsd_avx(auVar18._16_16_,local_2550);
          auVar34 = vpmaxsd_avx(auVar46,auVar103);
          auVar48._16_16_ = auVar35;
          auVar48._0_16_ = auVar34;
          auVar35 = vpmaxsd_avx(auVar19._16_16_,auVar126._16_16_);
          auVar34 = vpmaxsd_avx(auVar36,auVar124);
          auVar41._16_16_ = auVar35;
          auVar41._0_16_ = auVar34;
          auVar41 = vminps_avx(auVar48,auVar41);
          auVar72 = ZEXT3264(local_25c0);
          auVar6 = vmaxps_avx(local_25c0,_local_2580);
          auVar91 = vmaxps_avx(auVar6,auVar91);
          local_25e0._4_4_ = auVar91._4_4_ * 0.99999964;
          local_25e0._0_4_ = auVar91._0_4_ * 0.99999964;
          local_25e0._8_4_ = auVar91._8_4_ * 0.99999964;
          local_25e0._12_4_ = auVar91._12_4_ * 0.99999964;
          local_25e0._16_4_ = auVar91._16_4_ * 0.99999964;
          local_25e0._20_4_ = auVar91._20_4_ * 0.99999964;
          local_25e0._24_4_ = auVar91._24_4_ * 0.99999964;
          local_25e0._28_4_ = auVar91._28_4_;
          auVar91 = vminps_avx(auVar33._0_32_,auVar55);
          auVar91 = vminps_avx(auVar91,auVar41);
          auVar6._4_4_ = auVar91._4_4_ * 1.0000004;
          auVar6._0_4_ = auVar91._0_4_ * 1.0000004;
          auVar6._8_4_ = auVar91._8_4_ * 1.0000004;
          auVar6._12_4_ = auVar91._12_4_ * 1.0000004;
          auVar6._16_4_ = auVar91._16_4_ * 1.0000004;
          auVar6._20_4_ = auVar91._20_4_ * 1.0000004;
          auVar6._24_4_ = auVar91._24_4_ * 1.0000004;
          auVar6._28_4_ = auVar91._28_4_;
          auVar91 = vcmpps_avx(local_25e0,auVar6,2);
          auVar35 = vpackssdw_avx(auVar91._0_16_,auVar91._16_16_);
          auVar92 = ZEXT3264(local_24a0);
          auVar95 = ZEXT3264(local_24c0);
          auVar106 = ZEXT3264(local_24e0);
          auVar116 = ZEXT3264(local_2500);
          auVar123 = ZEXT3264(local_2520);
          auVar127 = ZEXT3264(local_2540);
        }
        auVar35 = vpsllw_avx(auVar35,0xf);
        if ((((((((auVar35 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar35 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar35 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar35 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar35[0xf]
           ) goto LAB_00e4ff4a;
        auVar35 = vpacksswb_avx(auVar35,auVar35);
        bVar9 = SUB161(auVar35 >> 7,0) & 1 | (SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar35 >> 0x17,0) & 1) << 2 | (SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar35 >> 0x27,0) & 1) << 4 | (SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar35 >> 0x37,0) & 1) << 6 | SUB161(auVar35 >> 0x3f,0) << 7;
        uVar23 = uVar25 & 0xfffffffffffffff0;
        lVar24 = 0;
        if (bVar9 != 0) {
          for (; (bVar9 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
          }
        }
        uVar25 = *(ulong *)(uVar23 + lVar24 * 8);
        uVar27 = bVar9 - 1 & (uint)bVar9;
        if (uVar27 != 0) {
          uVar3 = *(uint *)(local_25e0 + lVar24 * 4);
          lVar24 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
            }
          }
          uVar5 = *(ulong *)(uVar23 + lVar24 * 8);
          uVar4 = *(uint *)(local_25e0 + lVar24 * 4);
          uVar27 = uVar27 - 1 & uVar27;
          if (uVar27 == 0) {
            if (uVar3 < uVar4) {
              *(ulong *)*pauVar30 = uVar5;
              *(uint *)(*pauVar30 + 8) = uVar4;
              pauVar30 = pauVar30 + 1;
            }
            else {
              *(ulong *)*pauVar30 = uVar25;
              *(uint *)(*pauVar30 + 8) = uVar3;
              uVar25 = uVar5;
              pauVar30 = pauVar30 + 1;
            }
          }
          else {
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar25;
            auVar35 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar3));
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar5;
            auVar34 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar4));
            lVar24 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
              }
            }
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar23 + lVar24 * 8);
            auVar36 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_25e0 + lVar24 * 4)));
            auVar79 = vpcmpgtd_avx(auVar34,auVar35);
            uVar27 = uVar27 - 1 & uVar27;
            if (uVar27 == 0) {
              auVar62 = vpshufd_avx(auVar79,0xaa);
              auVar79 = vblendvps_avx(auVar34,auVar35,auVar62);
              auVar35 = vblendvps_avx(auVar35,auVar34,auVar62);
              auVar34 = vpcmpgtd_avx(auVar36,auVar79);
              auVar62 = vpshufd_avx(auVar34,0xaa);
              auVar34 = vblendvps_avx(auVar36,auVar79,auVar62);
              auVar79 = vblendvps_avx(auVar79,auVar36,auVar62);
              auVar36 = vpcmpgtd_avx(auVar79,auVar35);
              auVar62 = vpshufd_avx(auVar36,0xaa);
              auVar36 = vblendvps_avx(auVar79,auVar35,auVar62);
              auVar35 = vblendvps_avx(auVar35,auVar79,auVar62);
              *pauVar30 = auVar35;
              pauVar30[1] = auVar36;
              uVar25 = auVar34._0_8_;
              pauVar30 = pauVar30 + 2;
            }
            else {
              lVar24 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                }
              }
              auVar69._8_8_ = 0;
              auVar69._0_8_ = *(ulong *)(uVar23 + lVar24 * 8);
              auVar62 = vpunpcklqdq_avx(auVar69,ZEXT416(*(uint *)(local_25e0 + lVar24 * 4)));
              uVar27 = uVar27 - 1 & uVar27;
              uVar25 = (ulong)uVar27;
              if (uVar27 == 0) {
                auVar64 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar34,auVar35,auVar64);
                auVar35 = vblendvps_avx(auVar35,auVar34,auVar64);
                auVar34 = vpcmpgtd_avx(auVar62,auVar36);
                auVar64 = vpshufd_avx(auVar34,0xaa);
                auVar34 = vblendvps_avx(auVar62,auVar36,auVar64);
                auVar36 = vblendvps_avx(auVar36,auVar62,auVar64);
                auVar62 = vpcmpgtd_avx(auVar36,auVar35);
                auVar64 = vpshufd_avx(auVar62,0xaa);
                auVar62 = vblendvps_avx(auVar36,auVar35,auVar64);
                auVar35 = vblendvps_avx(auVar35,auVar36,auVar64);
                auVar36 = vpcmpgtd_avx(auVar34,auVar79);
                auVar64 = vpshufd_avx(auVar36,0xaa);
                auVar36 = vblendvps_avx(auVar34,auVar79,auVar64);
                auVar34 = vblendvps_avx(auVar79,auVar34,auVar64);
                auVar79 = vpcmpgtd_avx(auVar62,auVar34);
                auVar64 = vpshufd_avx(auVar79,0xaa);
                auVar79 = vblendvps_avx(auVar62,auVar34,auVar64);
                auVar34 = vblendvps_avx(auVar34,auVar62,auVar64);
                *pauVar30 = auVar35;
                pauVar30[1] = auVar34;
                pauVar30[2] = auVar79;
                uVar25 = auVar36._0_8_;
                pauVar22 = pauVar30 + 3;
              }
              else {
                *pauVar30 = auVar35;
                pauVar30[1] = auVar34;
                pauVar30[2] = auVar36;
                pauVar22 = pauVar30 + 3;
                pauVar30[3] = auVar62;
                do {
                  lVar24 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                    }
                  }
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = *(ulong *)(uVar23 + lVar24 * 8);
                  auVar35 = vpunpcklqdq_avx(auVar38,ZEXT416(*(uint *)(local_25e0 + lVar24 * 4)));
                  pauVar22[1] = auVar35;
                  pauVar22 = pauVar22 + 1;
                  uVar25 = uVar25 & uVar25 - 1;
                } while (uVar25 != 0);
                lVar24 = 0;
                while (pauVar22 != pauVar30) {
                  auVar35 = pauVar30[1];
                  uVar27 = vextractps_avx(auVar35,2);
                  for (lVar26 = 0x10;
                      (lVar24 != lVar26 && (*(uint *)(pauVar30[-1] + lVar26 + 8) < uVar27));
                      lVar26 = lVar26 + -0x10) {
                    *(undefined1 (*) [16])(*pauVar30 + lVar26) =
                         *(undefined1 (*) [16])(pauVar30[-1] + lVar26);
                  }
                  *(undefined1 (*) [16])(*pauVar30 + lVar26) = auVar35;
                  lVar24 = lVar24 + -0x10;
                  pauVar30 = pauVar30 + 1;
                }
                uVar25 = *(ulong *)*pauVar22;
              }
              auVar72 = ZEXT3264(local_25c0);
              pauVar30 = pauVar22;
            }
          }
        }
        goto LAB_00e4ff71;
      }
      goto LAB_00e4ff4a;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }